

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<const_QWidget_*,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>>::findNode<QWidget_const*>
          (Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>> *this,QWidget **key)

{
  byte bVar1;
  Node<const_QWidget_*,_QHashDummyValue> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QWidget_const*>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<const_QWidget_*,_QHashDummyValue> *)0x0;
  }
  else {
    pNVar2 = (Node<const_QWidget_*,_QHashDummyValue> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }